

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall
cmServer::WriteProgress
          (cmServer *this,cmServerRequest *request,int min,int current,int max,string *message)

{
  Value *pVVar1;
  cmServer *this_00;
  Value obj;
  Value VStack_168;
  undefined1 local_140 [80];
  Value local_f0;
  Value local_c8;
  Value local_a0;
  Value local_78;
  Value local_50;
  
  if ((min <= current) && (current <= max)) {
    if (message->_M_string_length != 0) {
      Json::Value::Value(&VStack_168,objectValue);
      Json::Value::Value(&local_50,&kPROGRESS_TYPE_abi_cxx11_);
      pVVar1 = Json::Value::operator[](&VStack_168,&kTYPE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,&local_50);
      Json::Value::~Value(&local_50);
      Json::Value::Value(&local_78,&request->Type);
      pVVar1 = Json::Value::operator[](&VStack_168,&kREPLY_TO_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,&local_78);
      Json::Value::~Value(&local_78);
      Json::Value::Value(&local_a0,&request->Cookie);
      pVVar1 = Json::Value::operator[](&VStack_168,&kCOOKIE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,&local_a0);
      Json::Value::~Value(&local_a0);
      Json::Value::Value(&local_c8,message);
      pVVar1 = Json::Value::operator[](&VStack_168,&kPROGRESS_MESSAGE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,&local_c8);
      Json::Value::~Value(&local_c8);
      Json::Value::Value(&local_f0,min);
      pVVar1 = Json::Value::operator[](&VStack_168,&kPROGRESS_MINIMUM_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,&local_f0);
      Json::Value::~Value(&local_f0);
      Json::Value::Value((Value *)(local_140 + 0x28),max);
      pVVar1 = Json::Value::operator[](&VStack_168,&kPROGRESS_MAXIMUM_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,(Value *)(local_140 + 0x28));
      Json::Value::~Value((Value *)(local_140 + 0x28));
      Json::Value::Value((Value *)local_140,current);
      pVVar1 = Json::Value::operator[](&VStack_168,&kPROGRESS_CURRENT_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar1,(Value *)local_140);
      this_00 = (cmServer *)local_140;
      Json::Value::~Value((Value *)this_00);
      WriteJsonObject(this_00,request->Connection,&VStack_168,(DebugInfo *)0x0);
      Json::Value::~Value(&VStack_168);
      return;
    }
    __assert_fail("message.length() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0x13c,
                  "void cmServer::WriteProgress(const cmServerRequest &, int, int, int, const std::string &) const"
                 );
  }
  __assert_fail("min <= current && current <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x13b,
                "void cmServer::WriteProgress(const cmServerRequest &, int, int, int, const std::string &) const"
               );
}

Assistant:

void cmServer::WriteProgress(const cmServerRequest& request, int min,
                             int current, int max,
                             const std::string& message) const
{
  assert(min <= current && current <= max);
  assert(message.length() != 0);

  Json::Value obj = Json::objectValue;
  obj[kTYPE_KEY] = kPROGRESS_TYPE;
  obj[kREPLY_TO_KEY] = request.Type;
  obj[kCOOKIE_KEY] = request.Cookie;
  obj[kPROGRESS_MESSAGE_KEY] = message;
  obj[kPROGRESS_MINIMUM_KEY] = min;
  obj[kPROGRESS_MAXIMUM_KEY] = max;
  obj[kPROGRESS_CURRENT_KEY] = current;

  this->WriteJsonObject(request.Connection, obj, nullptr);
}